

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fileHasMoved(unixFile *pFile)

{
  int iVar1;
  bool local_a2;
  bool local_a1;
  undefined1 local_a0 [8];
  stat buf;
  unixFile *pFile_local;
  
  local_a1 = false;
  if (pFile->pInode != (unixInodeInfo *)0x0) {
    buf.__glibc_reserved[2] = (__syscall_slong_t)pFile;
    iVar1 = (*aSyscall[4].pCurrent)(pFile->zPath,local_a0);
    local_a2 = true;
    if (iVar1 == 0) {
      local_a2 = buf.st_dev != *(__dev_t *)(*(long *)(buf.__glibc_reserved[2] + 0x10) + 8);
    }
    local_a1 = local_a2;
  }
  return (int)local_a1;
}

Assistant:

static int fileHasMoved(unixFile *pFile){
#if OS_VXWORKS
  return pFile->pInode!=0 && pFile->pId!=pFile->pInode->fileId.pId;
#else
  struct stat buf;
  return pFile->pInode!=0 &&
      (osStat(pFile->zPath, &buf)!=0
         || (u64)buf.st_ino!=pFile->pInode->fileId.ino);
#endif
}